

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::write
          (BlockedRead *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  undefined4 in_register_00000034;
  BlockedRead *this_00;
  bool bVar2;
  ArrayPtr<const_unsigned_char> data;
  Fault f_1;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_77;
  void *local_70;
  char *pcStack_68;
  bool bStack_58;
  undefined7 uStack_57;
  NullableValue<kj::OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_>
  _kj_switch_subject;
  
  this_00 = (BlockedRead *)CONCAT44(in_register_00000034,__fd);
  bVar2 = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  __kjCondition = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)CONCAT71(uStack_77,bVar2);
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              ((Fault *)&_kj_switch_subject,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3b4,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal((Fault *)&_kj_switch_subject);
  }
  data.size_ = __n;
  data.ptr = (uchar *)__buf;
  writeImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
             *)&_kjCondition,this_00,data,
            (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>)ZEXT816(0));
  _kj_switch_subject.isSet = true;
  _kj_switch_subject.field_1.value.tag = __kjCondition;
  if (__kjCondition == 2) {
    _kj_switch_subject.field_1._32_8_ = CONCAT71(uStack_57,bStack_58);
    _kj_switch_subject.field_1._8_8_ = local_70;
    _kj_switch_subject.field_1._16_8_ = pcStack_68;
    uVar1 = 1;
  }
  else {
    uVar1 = __kjCondition - 1;
    if (uVar1 < 2) {
      uVar1 = 0;
    }
  }
  if (uVar1 == 1) {
    __kjCondition =
         (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)
         ((long)&_kj_switch_subject.field_1 + 0x18);
    if (_kj_switch_subject.field_1._32_8_ != 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>&,decltype(nullptr)>&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x3bb,FAILED,"retry.moreData == nullptr","_kjCondition,",
                 (DebugComparison<kj::ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>_&,_std::nullptr_t>
                  *)&_kjCondition);
      kj::_::Debug::Fault::fatal(&f_1);
    }
    AsyncPipe::write((AsyncPipe *)this,(int)this_00->pipe,(void *)_kj_switch_subject.field_1._8_8_,
                     _kj_switch_subject.field_1._16_8_);
  }
  else {
    if (uVar1 != 0) {
      kj::_::unreachable();
    }
    kj::_::readyNow();
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)__kjCondition;
  }
  return (ssize_t)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}